

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ConfigUseClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConfigUseClauseSyntax,slang::syntax::ConfigUseClauseSyntax_const&>
          (BumpAllocator *this,ConfigUseClauseSyntax *args)

{
  undefined4 uVar1;
  ConfigUseClauseSyntax *pCVar2;
  long lVar3;
  ConfigUseClauseSyntax *pCVar4;
  byte bVar5;
  
  bVar5 = 0;
  pCVar2 = (ConfigUseClauseSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConfigUseClauseSyntax *)this->endPtr < pCVar2 + 1) {
    pCVar2 = (ConfigUseClauseSyntax *)allocateSlow(this,0x58,8);
  }
  else {
    this->head->current = (byte *)(pCVar2 + 1);
  }
  pCVar4 = pCVar2;
  for (lVar3 = 0xb; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined4 *)&(args->super_ConfigRuleClauseSyntax).super_SyntaxNode.field_0x4;
    (pCVar4->super_ConfigRuleClauseSyntax).super_SyntaxNode.kind =
         (args->super_ConfigRuleClauseSyntax).super_SyntaxNode.kind;
    *(undefined4 *)&(pCVar4->super_ConfigRuleClauseSyntax).super_SyntaxNode.field_0x4 = uVar1;
    args = (ConfigUseClauseSyntax *)((long)args + (ulong)bVar5 * -0x10 + 8);
    pCVar4 = (ConfigUseClauseSyntax *)((long)pCVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return pCVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }